

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void __thiscall crsGA::Logger::Logger(Logger *this)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_79;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  string local_68;
  LogHandlerPtr local_48;
  LogHandlerPtr local_38;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_00113bd0;
  p_Var1 = &(this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->_logHandlersMap)._M_t._M_impl = 0;
  *(undefined8 *)&(this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->_logHandlersMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_currentLogLevel = LOG_NOTICE;
  (this->_exit)._M_base._M_i = false;
  (this->_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  ThreadSafeQueue<crsGA::Logger::LogMessage>::ThreadSafeQueue(&this->_queue);
  (this->_thread)._M_id._M_thread = 0;
  std::make_shared<StandardOutputLogHandler>();
  local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"StandardOutputLogHandler",&local_79);
  addLogHandler(this,&local_38,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::make_shared<DefaultFileLogHandler>();
  local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_78;
  local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_70._M_pi;
  local_78 = (element_type *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"DefaultFileLogHandler",&local_79);
  addLogHandler(this,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<crsGA::LogHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  return;
}

Assistant:

Logger::Logger()
    : _logHandlersMap()
    , _currentLogLevel(LOG_NOTICE)
    , _exit(false)
    , _mutex()
    , _queue()
    , _thread()
{
    addLogHandler(std::make_shared<StandardOutputLogHandler>(), std::string("StandardOutputLogHandler"));
    addLogHandler(std::make_shared<DefaultFileLogHandler>(), std::string("DefaultFileLogHandler"));
}